

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.h
# Opt level: O1

bool __thiscall
spvtools::opt::BasicBlock::WhileEachInst
          (BasicBlock *this,function<bool_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  bool bVar2;
  undefined3 in_register_00000011;
  Instruction *dbg_line;
  Instruction *pIVar3;
  Instruction *pIVar4;
  Instruction *dbg_line_1;
  Instruction *pIVar5;
  bool bVar6;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_48;
  undefined4 local_3c;
  BasicBlock *local_38;
  
  local_3c = CONCAT31(in_register_00000011,run_on_debug_line_insts);
  pIVar4 = (this->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar4 != (Instruction *)0x0) {
    local_38 = this;
    if (run_on_debug_line_insts) {
      pIVar3 = (pIVar4->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar5 = *(pointer *)
                ((long)&(pIVar4->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      if (pIVar3 != pIVar5) {
        bVar6 = false;
        do {
          local_48._M_head_impl = pIVar3;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005c127a;
          bVar2 = (*f->_M_invoker)((_Any_data *)f,&local_48._M_head_impl);
          if (!bVar2) {
            if (!bVar6) {
              return false;
            }
            break;
          }
          pIVar3 = pIVar3 + 1;
          bVar6 = pIVar3 == pIVar5;
        } while (!bVar6);
      }
    }
    local_48._M_head_impl = pIVar4;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_005c127a:
      std::__throw_bad_function_call();
    }
    bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_48._M_head_impl);
    this = local_38;
    if (!bVar6) {
      return false;
    }
  }
  pIVar4 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar4 == (Instruction *)0x0) {
    return true;
  }
  if ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
    return true;
  }
  do {
    if (pIVar4 == (Instruction *)0x0) {
      return pIVar4 == (Instruction *)0x0;
    }
    pIVar3 = (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
      pIVar3 = (Instruction *)0x0;
    }
    if ((char)local_3c != '\0') {
      pIVar5 = (pIVar4->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar1 = (pIVar4->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar5 != pIVar1) {
        bVar6 = false;
        do {
          local_48._M_head_impl = pIVar5;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005c127a;
          bVar2 = (*f->_M_invoker)((_Any_data *)f,&local_48._M_head_impl);
          if (!bVar2) {
            if (!bVar6) {
              bVar6 = false;
              goto LAB_005c125b;
            }
            break;
          }
          pIVar5 = pIVar5 + 1;
          bVar6 = pIVar5 == pIVar1;
        } while (!bVar6);
      }
    }
    local_48._M_head_impl = pIVar4;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005c127a;
    bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_48._M_head_impl);
LAB_005c125b:
    pIVar4 = pIVar3;
    if (bVar6 == false) {
      return false;
    }
  } while( true );
}

Assistant:

inline bool BasicBlock::WhileEachInst(
    const std::function<bool(Instruction*)>& f, bool run_on_debug_line_insts) {
  if (label_) {
    if (!label_->WhileEachInst(f, run_on_debug_line_insts)) return false;
  }
  if (insts_.empty()) {
    return true;
  }

  Instruction* inst = &insts_.front();
  while (inst != nullptr) {
    Instruction* next_instruction = inst->NextNode();
    if (!inst->WhileEachInst(f, run_on_debug_line_insts)) return false;
    inst = next_instruction;
  }
  return true;
}